

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_luma_subsampling_420_lbd_avx2
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m256i sum_16x16;
  __m256i bot_16x16;
  __m256i top_16x16;
  __m256i bot;
  __m256i top;
  __m256i *row_end;
  __m256i *row;
  int luma_stride;
  __m256i twos;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 *local_1f0;
  undefined1 (*local_1a0) [32];
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar4 = vpinsrb_avx(ZEXT116(2),2,1);
  auVar4 = vpinsrb_avx(auVar4,2,2);
  auVar4 = vpinsrb_avx(auVar4,2,3);
  auVar4 = vpinsrb_avx(auVar4,2,4);
  auVar4 = vpinsrb_avx(auVar4,2,5);
  auVar4 = vpinsrb_avx(auVar4,2,6);
  auVar4 = vpinsrb_avx(auVar4,2,7);
  auVar4 = vpinsrb_avx(auVar4,2,8);
  auVar4 = vpinsrb_avx(auVar4,2,9);
  auVar4 = vpinsrb_avx(auVar4,2,10);
  auVar4 = vpinsrb_avx(auVar4,2,0xb);
  auVar4 = vpinsrb_avx(auVar4,2,0xc);
  auVar4 = vpinsrb_avx(auVar4,2,0xd);
  auVar4 = vpinsrb_avx(auVar4,2,0xe);
  auVar4 = vpinsrb_avx(auVar4,2,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(2),2,1);
  auVar3 = vpinsrb_avx(auVar3,2,2);
  auVar3 = vpinsrb_avx(auVar3,2,3);
  auVar3 = vpinsrb_avx(auVar3,2,4);
  auVar3 = vpinsrb_avx(auVar3,2,5);
  auVar3 = vpinsrb_avx(auVar3,2,6);
  auVar3 = vpinsrb_avx(auVar3,2,7);
  auVar3 = vpinsrb_avx(auVar3,2,8);
  auVar3 = vpinsrb_avx(auVar3,2,9);
  auVar3 = vpinsrb_avx(auVar3,2,10);
  auVar3 = vpinsrb_avx(auVar3,2,0xb);
  auVar3 = vpinsrb_avx(auVar3,2,0xc);
  auVar3 = vpinsrb_avx(auVar3,2,0xd);
  auVar3 = vpinsrb_avx(auVar3,2,0xe);
  auVar3 = vpinsrb_avx(auVar3,2,0xf);
  auVar3 = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
  auVar4 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_70 = auVar4._0_8_;
  uStack_68 = auVar4._8_8_;
  local_1f0 = in_RDX;
  local_1a0 = in_RDI;
  do {
    auVar1._16_8_ = uStack_70;
    auVar1._0_16_ = auVar3;
    auVar1._24_8_ = uStack_68;
    auVar1 = vpmaddubsw_avx2(*local_1a0,auVar1);
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar3;
    auVar2._24_8_ = uStack_68;
    auVar2 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*local_1a0 + in_ESI),auVar2);
    auVar1 = vpaddw_avx2(auVar1,auVar2);
    local_2a0 = auVar1._0_8_;
    uStack_298 = auVar1._8_8_;
    uStack_290 = auVar1._16_8_;
    uStack_288 = auVar1._24_8_;
    *local_1f0 = local_2a0;
    local_1f0[1] = uStack_298;
    local_1f0[2] = uStack_290;
    local_1f0[3] = uStack_288;
    local_1a0 = (undefined1 (*) [32])(*local_1a0 + (in_ESI << 1));
    local_1f0 = local_1f0 + 8;
  } while (local_1f0 < in_RDX + (long)((in_R8D >> 1) << 1) * 4);
  return;
}

Assistant:

static void cfl_luma_subsampling_420_lbd_avx2(const uint8_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;                               // Forever 32
  const __m256i twos = _mm256_set1_epi8(2);  // Thirty two twos
  const int luma_stride = input_stride << 1;
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + (height >> 1) * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i bot = _mm256_loadu_si256((__m256i *)(input + input_stride));

    __m256i top_16x16 = _mm256_maddubs_epi16(top, twos);
    __m256i bot_16x16 = _mm256_maddubs_epi16(bot, twos);
    __m256i sum_16x16 = _mm256_add_epi16(top_16x16, bot_16x16);

    _mm256_storeu_si256(row, sum_16x16);

    input += luma_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}